

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O1

void __thiscall
QFontEngine::setGlyphCache(QFontEngine *this,void *context,QFontEngineGlyphCache *cache)

{
  QSharedData *pQVar1;
  byte bVar2;
  qreal qVar3;
  long lVar4;
  void *pvVar5;
  _func_int ***ppp_Var6;
  QFontEngineGlyphCache *pQVar7;
  _List_node_base *p_Var8;
  long lVar9;
  long *plVar10;
  iterator __end1;
  long *plVar11;
  long in_FS_OFFSET;
  GlyphCacheEntry entry;
  void *local_48;
  TryEmplaceResult local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = context;
  QHash<void_const*,std::__cxx11::list<QFontEngine::GlyphCacheEntry,std::allocator<QFontEngine::GlyphCacheEntry>>>
  ::tryEmplace_impl<void_const*const&>
            (&local_40,
             (QHash<void_const*,std::__cxx11::list<QFontEngine::GlyphCacheEntry,std::allocator<QFontEngine::GlyphCacheEntry>>>
              *)&this->m_glyphCaches,&local_48);
  qVar3 = ((QTransform *)&(local_40.iterator.i.d)->numBuckets)->m_matrix[0][2];
  lVar9 = (local_40.iterator.i.bucket >> 7) * 0x90;
  lVar4 = *(long *)((long)qVar3 + 0x80 + lVar9);
  bVar2 = *(byte *)((ulong)((uint)local_40.iterator.i.bucket & 0x7f) + (long)qVar3 + lVar9);
  plVar11 = (long *)(lVar4 + (ulong)bVar2 * 0x20 + 8);
  plVar10 = plVar11;
  do {
    plVar10 = (long *)*plVar10;
    if (plVar10 == plVar11) {
      plVar10 = (long *)(lVar4 + (ulong)bVar2 * 0x20 + 0x18);
      if (*plVar10 == 4) {
        pvVar5 = *(void **)(lVar4 + 0x10 + (ulong)bVar2 * 0x20);
        *plVar10 = 3;
        std::__detail::_List_node_base::_M_unhook();
        GlyphCacheEntry::~GlyphCacheEntry((GlyphCacheEntry *)((long)pvVar5 + 0x10));
        operator_delete(pvVar5,0x18);
      }
      local_40.iterator.i.d =
           (Data<QHashPrivate::Node<const_void_*,_std::__cxx11::list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>_>_>
            *)&DAT_aaaaaaaaaaaaaaaa;
      GlyphCacheEntry::GlyphCacheEntry((GlyphCacheEntry *)&local_40);
      pQVar7 = (QFontEngineGlyphCache *)local_40.iterator.i.d;
      if ((QFontEngineGlyphCache *)local_40.iterator.i.d != cache) {
        if (cache != (QFontEngineGlyphCache *)0x0) {
          LOCK();
          (cache->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i =
               (cache->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pQVar7 = cache;
        if ((QFontEngineGlyphCache *)local_40.iterator.i.d != (QFontEngineGlyphCache *)0x0) {
          LOCK();
          pQVar1 = (QSharedData *)&(local_40.iterator.i.d)->size;
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          pQVar7 = cache;
          if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            ppp_Var6 = (_func_int ***)&(local_40.iterator.i.d)->ref;
            local_40.iterator.i.d =
                 (Data<QHashPrivate::Node<const_void_*,_std::__cxx11::list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>_>_>
                  *)cache;
            (*(*ppp_Var6)[1])();
            pQVar7 = (QFontEngineGlyphCache *)local_40.iterator.i.d;
          }
        }
      }
      local_40.iterator.i.d =
           (Data<QHashPrivate::Node<const_void_*,_std::__cxx11::list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>_>_>
            *)pQVar7;
      p_Var8 = (_List_node_base *)operator_new(0x18);
      GlyphCacheEntry::GlyphCacheEntry((GlyphCacheEntry *)(p_Var8 + 1),(GlyphCacheEntry *)&local_40)
      ;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      *plVar10 = *plVar10 + 1;
      GlyphCacheEntry::~GlyphCacheEntry((GlyphCacheEntry *)&local_40);
      break;
    }
  } while ((QFontEngineGlyphCache *)plVar10[2] != cache);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontEngine::setGlyphCache(const void *context, QFontEngineGlyphCache *cache)
{
    Q_ASSERT(cache);

    GlyphCaches &caches = m_glyphCaches[context];
    for (auto & e : caches) {
        if (cache == e.cache.data())
            return;
    }

    // Limit the glyph caches to 4 per context. This covers all 90 degree rotations,
    // and limits memory use when there is continuous or random rotation
    if (caches.size() == 4)
        caches.pop_back();

    GlyphCacheEntry entry;
    entry.cache = cache;
    caches.push_front(entry);

}